

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::format<char[31],std::__cxx11::string>
               (ostream *out,char *fmt,char (*args) [31],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  long in_FS_OFFSET;
  FormatList local_48;
  FormatArg local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  code *local_18;
  code *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.m_args = &local_38;
  local_48.m_N = 2;
  local_38.m_formatImpl = detail::FormatArg::formatImpl<char[31]>;
  local_38.m_toIntImpl = detail::FormatArg::toIntImpl<char[31]>;
  local_18 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_10 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_38.m_value = args;
  local_20 = args_1;
  vformat(out,fmt,&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}